

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WeightParams * __thiscall
CoreML::Specification::LayerNormalizationLayerParams::mutable_beta
          (LayerNormalizationLayerParams *this)

{
  WeightParams *this_00;
  LayerNormalizationLayerParams *this_local;
  
  if (this->beta_ == (WeightParams *)0x0) {
    this_00 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(this_00);
    this->beta_ = this_00;
  }
  return this->beta_;
}

Assistant:

inline ::CoreML::Specification::WeightParams* LayerNormalizationLayerParams::mutable_beta() {
  
  if (beta_ == NULL) {
    beta_ = new ::CoreML::Specification::WeightParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LayerNormalizationLayerParams.beta)
  return beta_;
}